

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

uint64_t sum_quotients_vec<unsigned_short,libdivide::divider<unsigned_short,(libdivide::Branching)1>>
                   (random_numerators<unsigned_short> *vals,
                   divider<unsigned_short,_(libdivide::Branching)1> *div)

{
  uint32_t *puVar1;
  byte bVar2;
  ushort uVar3;
  uint32_t *puVar4;
  uint64_t uVar5;
  uint32_t yl;
  long lVar6;
  uint32_t xl;
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [64];
  __m512i sumX4;
  type_pun_vec result;
  undefined1 local_140 [64];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [2] [64];
  
  auVar9 = ZEXT1664((undefined1  [16])0x0);
  local_140 = vmovdqa64_avx512f(auVar9);
  puVar4 = vals->_pData;
  uVar3 = (div->div).denom.magic;
  bVar2 = (div->div).denom.more;
  puVar1 = (uint32_t *)((long)puVar4 + (ulong)vals->_length * 2);
  while (puVar4 != puVar1) {
    local_100 = *(undefined8 *)puVar4;
    uStack_f8 = *(undefined8 *)(puVar4 + 2);
    uStack_f0 = *(undefined8 *)(puVar4 + 4);
    uStack_e8 = *(undefined8 *)(puVar4 + 6);
    uStack_e0 = *(undefined8 *)(puVar4 + 8);
    uStack_d8 = *(undefined8 *)(puVar4 + 10);
    uStack_d0 = *(undefined8 *)(puVar4 + 0xc);
    uStack_c8 = *(undefined8 *)(puVar4 + 0xe);
    for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 1) {
      uVar7 = (uint)*(ushort *)((long)&local_100 + lVar6 * 2);
      uVar8 = uVar3 * uVar7 >> 0x10;
      *(short *)(local_c0[0] + lVar6 * 2) =
           (short)(((uVar7 - uVar8 >> 1) + uVar8 & 0xffff) >> (bVar2 & 0x1f));
    }
    auVar9 = vpaddw_avx512bw(auVar9,local_c0[0]);
    puVar4 = puVar4 + 0x10;
    local_140 = vmovdqa64_avx512f(auVar9);
  }
  uVar5 = unsigned_sum_vals<unsigned_short>((unsigned_short *)local_140,0x20);
  return uVar5;
}

Assistant:

NOINLINE uint64_t sum_quotients_vec(const random_numerators<IntT> &vals, const Divisor &div) {
    size_t count = sizeof(x86_VECTOR_TYPE) / sizeof(IntT);
    x86_VECTOR_TYPE sumX4 = SETZERO_SI();
    for (auto iter = vals.begin(); iter != vals.end(); iter += count) {
        x86_VECTOR_TYPE numers = LOAD_SI((const x86_VECTOR_TYPE *)iter);
        numers = numers / div;
        sumX4 = add_vector<sizeof(IntT)>(sumX4, numers);
    }
    return unsigned_sum_vals((const IntT *)&sumX4, count);
}